

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O3

DPJoinNode * __thiscall
duckdb::PlanEnumerator::EmitPair
          (PlanEnumerator *this,JoinRelationSet *left,JoinRelationSet *right,
          vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> *info)

{
  reference_map_t<JoinRelationSet,_unique_ptr<DPJoinNode>_> *this_00;
  double dVar1;
  _Hash_node_base *p_Var2;
  _Head_base<0UL,_duckdb::DPJoinNode_*,_false> _Var3;
  undefined8 uVar4;
  __node_base_ptr p_Var5;
  JoinRelationSet *possible_connections;
  type pDVar6;
  pointer pDVar7;
  mapped_type *pmVar8;
  InternalException *this_01;
  _Hash_node_base *p_Var9;
  __hash_code __code;
  key_type local_58;
  undefined1 local_50 [32];
  
  this_00 = &this->plans;
  p_Var9 = (_Hash_node_base *)0x0;
  local_50._0_8_ = left;
  p_Var5 = ::std::
           _Hashtable<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&this_00->_M_h,(ulong)left % (this->plans)._M_h._M_bucket_count,
                      (key_type *)local_50,(__hash_code)left);
  if (p_Var5 != (__node_base_ptr)0x0) {
    p_Var9 = p_Var5->_M_nxt;
  }
  local_50._0_8_ = right;
  p_Var5 = ::std::
           _Hashtable<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&this_00->_M_h,(ulong)right % (this->plans)._M_h._M_bucket_count,
                      (key_type *)local_50,(__hash_code)right);
  if (((p_Var5 == (__node_base_ptr)0x0) || (p_Var9 == (_Hash_node_base *)0x0)) ||
     (p_Var2 = p_Var5->_M_nxt, p_Var2 == (_Hash_node_base *)0x0)) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._0_8_ = local_50 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"No left or right plan: internal error in join order optimizer",""
              );
    InternalException::InternalException(this_01,(string *)local_50);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  possible_connections =
       JoinRelationSetManager::Union(&this->query_graph_manager->set_manager,left,right);
  pDVar6 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::operator*
                     ((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                       *)(p_Var9 + 2));
  unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::operator*
            ((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true> *)
             (p_Var2 + 2));
  CreateJoinTree((PlanEnumerator *)local_50,(JoinRelationSet *)this,
                 (vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> *)possible_connections,
                 (DPJoinNode *)info,pDVar6);
  local_58._M_data = possible_connections;
  p_Var5 = ::std::
           _Hashtable<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&this_00->_M_h,
                      (ulong)possible_connections % (this->plans)._M_h._M_bucket_count,&local_58,
                      (__hash_code)possible_connections);
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var9 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var9 = p_Var5->_M_nxt;
  }
  pDVar7 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::operator->
                     ((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                       *)local_50);
  if (p_Var9 != (_Hash_node_base *)0x0) {
    dVar1 = pDVar7->cost;
    pDVar7 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
             operator->((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                         *)(p_Var9 + 2));
    if (pDVar7->cost <= dVar1) {
      pDVar6 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
               operator*((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                          *)(p_Var9 + 2));
      goto LAB_00c65726;
    }
  }
  local_58._M_data = possible_connections;
  pmVar8 = ::std::__detail::
           _Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,&local_58);
  uVar4 = local_50._0_8_;
  local_50._0_8_ = (DPJoinNode *)0x0;
  _Var3._M_head_impl =
       (pmVar8->super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>)._M_t
       .super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>.
       super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl;
  (pmVar8->super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>)._M_t.
  super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>.
  super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl = (DPJoinNode *)uVar4;
  if (_Var3._M_head_impl != (DPJoinNode *)0x0) {
    operator_delete(_Var3._M_head_impl);
  }
  local_58._M_data = possible_connections;
  pmVar8 = ::std::__detail::
           _Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,&local_58);
  pDVar6 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::operator*
                     (pmVar8);
LAB_00c65726:
  if ((DPJoinNode *)local_50._0_8_ != (DPJoinNode *)0x0) {
    operator_delete((void *)local_50._0_8_);
  }
  return pDVar6;
}

Assistant:

DPJoinNode &PlanEnumerator::EmitPair(JoinRelationSet &left, JoinRelationSet &right,
                                     const vector<reference<NeighborInfo>> &info) {
	// get the left and right join plans
	auto left_plan = plans.find(left);
	auto right_plan = plans.find(right);
	if (left_plan == plans.end() || right_plan == plans.end()) {
		throw InternalException("No left or right plan: internal error in join order optimizer");
	}
	auto &new_set = query_graph_manager.set_manager.Union(left, right);
	// create the join tree based on combining the two plans
	auto new_plan = CreateJoinTree(new_set, info, *left_plan->second, *right_plan->second);
	// check if this plan is the optimal plan we found for this set of relations
	auto entry = plans.find(new_set);
	auto new_cost = new_plan->cost;
	double old_cost = NumericLimits<double>::Maximum();
	if (entry != plans.end()) {
		old_cost = entry->second->cost;
	}
	if (entry == plans.end() || new_cost < old_cost) {
		// the new plan costs less than the old plan. Update our DP table.
		plans[new_set] = std::move(new_plan);
		return *plans[new_set];
	}
	// Create join node from the plan currently in the DP table.
	return *entry->second;
}